

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

void lj_err_throw(lua_State *L,int errcode)

{
  uint *puVar1;
  code *pcVar2;
  ulong uVar3;
  long *in_FS_OFFSET;
  
  uVar3 = (ulong)(L->glref).ptr32;
  puVar1 = (uint *)(uVar3 + 0x31c);
  *puVar1 = *puVar1 & 0xffffffef;
  L->status = '\0';
  in_FS_OFFSET[-6] = 0;
  in_FS_OFFSET[-5] = 0;
  in_FS_OFFSET[-2] = 0;
  in_FS_OFFSET[-1] = 0;
  in_FS_OFFSET[-4] = 0;
  in_FS_OFFSET[-3] = 0;
  in_FS_OFFSET[-6] = (long)errcode | 0x4c55414a49543200;
  in_FS_OFFSET[-2] = uVar3;
  _Unwind_RaiseException(*in_FS_OFFSET + -0x30);
  pcVar2 = *(code **)((ulong)(L->glref).ptr32 + 0x178);
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(L);
  }
  exit(1);
}

Assistant:

LJ_FASTCALL lj_err_throw(lua_State *L, int errcode)
{
  global_State *g = G(L);
  lj_trace_abort(g);
  L->status = LUA_OK;
#if LJ_UNWIND_EXT
  err_raise_ext(g, errcode);
  /*
  ** A return from this function signals a corrupt C stack that cannot be
  ** unwound. We have no choice but to call the panic function and exit.
  **
  ** Usually this is caused by a C function without unwind information.
  ** This may happen if you've manually enabled LUAJIT_UNWIND_EXTERNAL
  ** and forgot to recompile *every* non-C++ file with -funwind-tables.
  */
  if (G(L)->panic)
    G(L)->panic(L);
#else
#if LJ_HASJIT
  setmref(g->jit_base, NULL);
#endif
  {
    void *cf = err_unwind(L, NULL, errcode);
    if (cframe_unwind_ff(cf))
      lj_vm_unwind_ff(cframe_raw(cf));
    else
      lj_vm_unwind_c(cframe_raw(cf), errcode);
  }
#endif
  exit(EXIT_FAILURE);
}